

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_engine.h
# Opt level: O3

void __thiscall
absl::lts_20250127::random_internal::randen_engine<unsigned_long>::
reseed<absl::lts_20250127::random_internal::RandenPoolSeedSeq>
          (randen_engine<unsigned_long> *this,RandenPoolSeedSeq *seq)

{
  undefined4 uVar1;
  ulong uVar2;
  size_type extraout_RDX;
  uint *a;
  Span<unsigned_char> data;
  sequence_result_type buffer [60];
  undefined4 auStack_118 [6];
  undefined8 uStack_100;
  RandenPool<unsigned_char> aRStack_f8 [32];
  undefined1 local_d8 [120];
  undefined4 auStack_60 [22];
  
  uStack_100 = 0x17ce0e;
  memset(local_d8,0,0xd0);
  uStack_100 = 0x17ce1b;
  data.len_ = extraout_RDX;
  data.ptr_ = (pointer)0x20;
  RandenPool<unsigned_char>::Fill(aRStack_f8,data);
  uVar2 = 0x3c;
  do {
    uVar1 = auStack_118[uVar2 + 3];
    auStack_118[uVar2 + 3] = *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 0x14);
    *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 0x14) = uVar1;
    uVar1 = auStack_118[uVar2 + 2];
    auStack_118[uVar2 + 2] = *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 0x10);
    *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 0x10) = uVar1;
    uVar1 = auStack_118[uVar2 + 1];
    auStack_118[uVar2 + 1] = *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 0xc);
    *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 0xc) = uVar1;
    uVar1 = auStack_118[uVar2];
    auStack_118[uVar2] = *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 8);
    *(undefined4 *)((long)auStack_118 + uVar2 * 2 + 8) = uVar1;
    uVar2 = uVar2 - 8;
  } while (7 < uVar2);
  if ((this->impl_).has_crypto_ == true) {
    uStack_100 = 0x17ce86;
    RandenHwAes::Absorb(aRStack_f8,this->raw_state_ + ((uint)this & 8));
  }
  else {
    uStack_100 = 0x17ce90;
    RandenSlow::Absorb(aRStack_f8,this->raw_state_ + ((uint)this & 8));
  }
  this->next_ = 0x20;
  return;
}

Assistant:

void reseed(SeedSequence& seq) {
    using sequence_result_type = typename SeedSequence::result_type;
    static_assert(sizeof(sequence_result_type) == 4,
                  "SeedSequence::result_type must be 32-bit");
    constexpr size_t kBufferSize =
        Randen::kSeedBytes / sizeof(sequence_result_type);
    alignas(16) sequence_result_type buffer[kBufferSize];

    // Randen::Absorb XORs the seed into state, which is then mixed by a call
    // to Randen::Generate. Seeding with only the provided entropy is preferred
    // to using an arbitrary generate() call, so use [rand.req.seed_seq]
    // size as a proxy for the number of entropy units that can be generated
    // without relying on seed sequence mixing...
    const size_t entropy_size = seq.size();
    if (entropy_size < kBufferSize) {
      // ... and only request that many values, or 256-bits, when unspecified.
      const size_t requested_entropy = (entropy_size == 0) ? 8u : entropy_size;
      std::fill(buffer + requested_entropy, buffer + kBufferSize, 0);
      seq.generate(buffer, buffer + requested_entropy);
#ifdef ABSL_IS_BIG_ENDIAN
      // Randen expects the seed buffer to be in Little Endian; reverse it on
      // Big Endian platforms.
      for (sequence_result_type& e : buffer) {
        e = absl::little_endian::FromHost(e);
      }
#endif
      // The Randen paper suggests preferentially initializing even-numbered
      // 128-bit vectors of the randen state (there are 16 such vectors).
      // The seed data is merged into the state offset by 128-bits, which
      // implies preferring seed bytes [16..31, ..., 208..223]. Since the
      // buffer is 32-bit values, we swap the corresponding buffer positions in
      // 128-bit chunks.
      size_t dst = kBufferSize;
      while (dst > 7) {
        // leave the odd bucket as-is.
        dst -= 4;
        size_t src = dst >> 1;
        // swap 128-bits into the even bucket
        std::swap(buffer[--dst], buffer[--src]);
        std::swap(buffer[--dst], buffer[--src]);
        std::swap(buffer[--dst], buffer[--src]);
        std::swap(buffer[--dst], buffer[--src]);
      }
    } else {
      seq.generate(buffer, buffer + kBufferSize);
    }
    impl_.Absorb(buffer, state());

    // Generate will be called when operator() is called
    next_ = kStateSizeT;
  }